

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O3

void wiz_create_item_display
               (menu_conflict *m,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  char *src;
  char buf [80];
  char acStack_68 [80];
  
  if (oid == L'\xffffd8f1') {
    if (choose_artifact) {
      src = "All artifacts";
    }
    else {
      src = "All objects";
    }
    my_strcpy(acStack_68,src,0x50);
  }
  else {
    object_base_name(acStack_68,0x50,oid,true);
  }
  c_prt(curs_attrs[1][cursor],acStack_68,row,col);
  return;
}

Assistant:

static void wiz_create_item_display(struct menu *m, int oid, bool cursor,
	int row, int col, int width)
{
	char buf[80];

	if (oid == WIZ_CREATE_ALL_MENU_ITEM) {
		if (choose_artifact) {
			my_strcpy(buf, "All artifacts", sizeof(buf));
		} else {
			my_strcpy(buf, "All objects", sizeof(buf));
		}
	} else {
		object_base_name(buf, sizeof(buf), oid, true);
	}

	c_prt(curs_attrs[CURS_KNOWN][0 != cursor], buf, row, col);
}